

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_line_profile_aa.cpp
# Opt level: O0

value_type * __thiscall agg::line_profile_aa::profile(line_profile_aa *this,double w)

{
  int iVar1;
  uint uVar2;
  uchar *puVar3;
  uint size;
  double w_local;
  line_profile_aa *this_local;
  
  iVar1 = uround(w * 256.0);
  *(int *)(this + 0x110) = iVar1;
  iVar1 = *(int *)(this + 0x110);
  uVar2 = pod_array<unsigned_char>::size((pod_array<unsigned_char> *)this);
  if (uVar2 < iVar1 + 0x600U) {
    pod_array<unsigned_char>::resize((pod_array<unsigned_char> *)this,iVar1 + 0x600U);
  }
  puVar3 = pod_array<unsigned_char>::operator[]((pod_array<unsigned_char> *)this,0);
  return puVar3;
}

Assistant:

line_profile_aa::value_type* line_profile_aa::profile(double w)
    {
        m_subpixel_width = uround(w * subpixel_scale);
        unsigned size = m_subpixel_width + subpixel_scale * 6;
        if(size > m_profile.size())
        {
            m_profile.resize(size);
        }
        return &m_profile[0];
    }